

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-server.c
# Opt level: O0

int main(int argc,char **argv)

{
  int in_EDI;
  sigaction act;
  _union_1457 local_a8 [3];
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  if (in_EDI < 4) {
    fprintf(_stderr,"Usage: libevent-server PORT KEY_FILE CERT_FILE\n");
    exit(1);
  }
  memset(local_a8,0,0x98);
  local_a8[0] = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)local_a8,(sigaction *)0x0);
  run(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  struct sigaction act;

  if (argc < 4) {
    fprintf(stderr, "Usage: libevent-server PORT KEY_FILE CERT_FILE\n");
    exit(EXIT_FAILURE);
  }

  memset(&act, 0, sizeof(struct sigaction));
  act.sa_handler = SIG_IGN;
  sigaction(SIGPIPE, &act, NULL);

  run(argv[1], argv[2], argv[3]);
  return 0;
}